

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall
CoinsViews::CoinsViews(CoinsViews *this,DBParams *db_params,CoinsViewOptions options)

{
  long lVar1;
  CoinsViewOptions options_00;
  undefined8 in_RDX;
  CCoinsViewDB *in_RSI;
  DBParams *in_RDI;
  long in_FS_OFFSET;
  DBParams *in_stack_ffffffffffffff58;
  DBParams *this_00;
  DBParams *in_stack_ffffffffffffff80;
  DBParams *pDVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pDVar2 = in_RDI;
  DBParams::DBParams(in_RDI,in_RDI);
  options_00._8_8_ = in_RDX;
  options_00.batch_write_bytes = (size_t)pDVar2;
  CCoinsViewDB::CCoinsViewDB(in_RSI,in_stack_ffffffffffffff80,options_00);
  DBParams::~DBParams(in_stack_ffffffffffffff58);
  CCoinsViewErrorCatcher::CCoinsViewErrorCatcher
            ((CCoinsViewErrorCatcher *)this_00,(CCoinsView *)in_RDI);
  std::unique_ptr<CCoinsViewCache,std::default_delete<CCoinsViewCache>>::
  unique_ptr<std::default_delete<CCoinsViewCache>,void>
            ((unique_ptr<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_> *)
             in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CoinsViews::CoinsViews(DBParams db_params, CoinsViewOptions options)
    : m_dbview{std::move(db_params), std::move(options)},
      m_catcherview(&m_dbview) {}